

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O0

bool __thiscall Strings::QuotedDecoding::unquoteChar(QuotedDecoding *this,char **input,char *out)

{
  char cVar1;
  char *pcVar2;
  char local_40;
  char local_3c;
  int local_38;
  int local_34;
  int hexValue;
  int ch;
  char *out_local;
  char **input_local;
  QuotedDecoding *this_local;
  
  pcVar2 = *input;
  *input = pcVar2 + 1;
  cVar1 = *pcVar2;
  do {
    if (cVar1 != '=') {
      *out = cVar1;
      return true;
    }
    pcVar2 = *input;
    *input = pcVar2 + 1;
    local_34 = (int)*pcVar2;
    if (local_34 == 0xd) {
      *input = *input + 1;
    }
    else {
      if ((((0x2f < local_34) && (local_34 < 0x3a)) || ((0x40 < local_34 && (local_34 < 0x47)))) ||
         ((0x60 < local_34 && (local_34 < 0x67)))) {
        if (local_34 < 0x3a) {
          local_34 = local_34 + -0x30;
        }
        else {
          if (local_34 < 0x47) {
            local_38 = local_34 + -0x37;
          }
          else {
            local_38 = local_34 + -0x57;
          }
          local_34 = local_38;
        }
        pcVar2 = *input;
        *input = pcVar2 + 1;
        local_3c = *pcVar2;
        if ((((local_3c < '0') || ('9' < local_3c)) && ((local_3c < 'A' || ('F' < local_3c)))) &&
           ((local_3c < 'a' || ('f' < local_3c)))) {
          return false;
        }
        if (local_3c < ':') {
          local_3c = local_3c + -0x30;
        }
        else {
          if (local_3c < 'G') {
            local_40 = -0x37;
          }
          else {
            local_40 = -0x57;
          }
          local_40 = local_3c + local_40;
          local_3c = local_40;
        }
        *out = local_3c + (char)(local_34 << 4);
        return true;
      }
      if (local_34 != 10) {
        return false;
      }
    }
    pcVar2 = *input;
    *input = pcVar2 + 1;
    cVar1 = *pcVar2;
  } while( true );
}

Assistant:

inline bool unquoteChar(const char * & input, char & out)
        {
	        int ch = *input++;
	        while (ch == '=')
	        {
		        ch = *input++;
		        // Filter CRLF
		        if (ch == '\r') ch = *input++;
#define IsHex(ch)	(ch >= '0' && ch <= '9') || (ch >= 'A' && ch <= 'F') || (ch >= 'a' && ch <= 'f')
		        else if (IsHex(ch))
		        {
		            int hexValue = ch <= '9' ? (ch - '0') : (ch <= 'F' ? ch - 'A' + 10 : ch - 'a' + 10);
			        ch = *input++;
			        if (IsHex(ch))
#undef IsHex
			        {
				        hexValue <<= 4;
				        hexValue += ch <= '9' ? (ch - '0') : (ch <= 'F' ? ch - 'A' + 10 : ch - 'a' + 10);
				        out = (char)hexValue;
				        return true;
			        }
                    return false;
		        }
		        else if (ch != '\n') return false;
		        ch = *input++;
	        }
	        out = (char)ch;
	        return true;
        }